

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O2

pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
libtorrent::aux::posix_storage::move_storage
          (pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,posix_storage *this,string *sp,move_flags_t flags,
          storage_error *ec)

{
  string *psVar1;
  undefined7 in_register_00000009;
  file_storage *f;
  status_t ret;
  bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> local_b5;
  undefined4 local_b4;
  string *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  string local_88;
  undefined1 local_68 [40];
  string *local_40;
  bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *local_38;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000009,flags);
  local_b5.m_val = '\0';
  f = (this->m_mapped_files)._M_t.
      super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
      .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (f == (file_storage *)0x0) {
    f = this->m_files;
  }
  psVar1 = &this->m_save_path;
  local_b0 = sp;
  ::std::__cxx11::string::string((string *)&local_88,(string *)psVar1);
  local_a8._8_8_ = 0;
  local_90 = ::std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::system::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:301:24)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::system::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/posix_storage.cpp:301:24)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  aux::move_storage((pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_68,f,&local_88,local_b0,
                    (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::system::error_code_&)>
                     *)&local_a8,(move_flags_t)local_b4,ec);
  local_38 = &local_b5;
  local_40 = psVar1;
  ::std::
  tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
  ::operator=((tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
               *)&local_40,
              (pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_68);
  ::std::__cxx11::string::~string((string *)(local_68 + 8));
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  stat_cache::clear(&this->m_stat_cache);
  (__return_storage_ptr__->first).m_val = local_b5.m_val;
  ::std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::pair<status_t, std::string> posix_storage::move_storage(std::string const& sp
		, move_flags_t const flags, storage_error& ec)
	{
		lt::status_t ret{};
		auto move_partfile = [&](std::string const& new_save_path, error_code& e)
		{
			if (!m_part_file) return;
			m_part_file->move_partfile(new_save_path, e);
		};
		std::tie(ret, m_save_path) = aux::move_storage(files(), m_save_path, sp
			, std::move(move_partfile), flags, ec);

		// clear the stat cache in case the new location has new files
		m_stat_cache.clear();

		return { ret, m_save_path };
	}